

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HistogramBasedDistribution.cpp
# Opt level: O1

void __thiscall
HistogramBasedDistribution::estimateGaussian
          (HistogramBasedDistribution *this,double *mean,double *stddev)

{
  pointer ppVar1;
  double dVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  ppVar1 = (this->values).
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar3 = (long)(this->values).
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4;
  dVar6 = 0.0;
  uVar4 = 1;
  dVar7 = 0.0;
  dVar8 = 0.0;
  dVar9 = 0.0;
  do {
    if (uVar4 - uVar3 == 1) break;
    iVar5 = this->max;
    if (uVar4 < uVar3) {
      iVar5 = ppVar1[1].first + -1;
    }
    dVar12 = (double)((iVar5 - ppVar1->first) + 1);
    dVar11 = ppVar1->second * dVar12;
    dVar10 = dVar9 + dVar11;
    dVar13 = (double)ppVar1->first;
    if (0.25 <= dVar10) {
      dVar8 = ((0.25 - dVar9) * dVar12) / dVar11 + dVar13;
    }
    if (0.5 <= dVar10) {
      dVar7 = ((0.5 - dVar9) * dVar12) / dVar11 + dVar13;
    }
    dVar2 = dVar10;
    if (0.75 <= dVar10) {
      dVar6 = ((0.75 - dVar9) * dVar12) / dVar11 + dVar13;
      dVar2 = dVar9;
    }
    dVar9 = dVar2;
    uVar4 = uVar4 + 1;
    ppVar1 = ppVar1 + 1;
  } while (dVar10 < 0.75);
  *mean = dVar7;
  *stddev = ((dVar6 - dVar8) * 0.5) / 0.6744898;
  return;
}

Assistant:

void HistogramBasedDistribution::estimateGaussian(double* mean, double* stddev) {
	double p_sum = 0.0;
	double q25 = 0;
	bool q25_set = false;
	double q50 = 0;
	bool q50_set = false;
	double q75 = 0;
	for (size_t i=0; i<values.size(); ++i) {
		int start = values[i].first;
		int end = (i+1 < values.size())? values[i+1].first-1:max;
		int length = end - start + 1;
		double p = values[i].second * length;
		if (!q25_set && (p_sum + p >= 0.25)) {
			q25 = start + ((double)length)*(0.25-p_sum)/p;
		}
		if (!q50_set && (p_sum + p >= 0.5)) {
			q50 = start + ((double)length)*(0.5-p_sum)/p;
		}
		if (p_sum + p >= 0.75) {
			q75 = start + ((double)length)*(0.75-p_sum)/p;
			break;
		}
		p_sum += p;
	}
	*mean = q50;
	*stddev = (q75 - q25) / 2 / 0.6744898;
}